

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O2

QString * formatLogMessage(QString *__return_storage_ptr__,QtMsgType type,
                          QMessageLogContext *context,QString *str)

{
  char *data;
  long lVar1;
  void *pvVar2;
  QString *pQVar3;
  QLatin1StringView str_00;
  Data DVar4;
  QByteArray info;
  QByteArray info_00;
  QByteArray info_01;
  QLatin1StringView latin1;
  Data *pDVar5;
  char16_t *pcVar6;
  bool bVar7;
  byte bVar8;
  int iVar9;
  Type *pTVar10;
  type ppcVar11;
  qint64 n;
  pthread_t __target_thread;
  QThread *n_00;
  QVarLengthArray<void_*,_32LL> *pQVar12;
  char *pcVar13;
  qsizetype qVar14;
  pointer pQVar15;
  storage_type *size;
  long lVar16;
  long lVar17;
  QBasicMutex *this;
  QArrayDataPointer<char16_t> *this_00;
  Data *pDVar18;
  size_t __i;
  QLatin1String *this_01;
  long in_FS_OFFSET;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  QLatin1StringView str_01;
  QLatin1StringView str_02;
  QLatin1StringView s;
  QLatin1StringView s_00;
  QLatin1StringView s_01;
  QLatin1StringView s_02;
  QLatin1StringView s_03;
  QLatin1StringView s_04;
  QUtf8StringView str_03;
  QByteArrayView ba;
  undefined1 auVar24 [16];
  qsizetype qStackY_270;
  undefined7 in_stack_fffffffffffffda0;
  int iVar25;
  int local_250;
  Data *local_238;
  QLatin1String local_1f8;
  QArrayDataPointer<char16_t> local_1e8;
  QArrayDataPointer<char> local_1d0;
  QLatin1String local_1b8;
  QArrayDataPointer<QString> local_1a8;
  QArrayDataPointer<char16_t> local_190;
  QArrayDataPointer<char16_t> local_178;
  QArrayDataPointer<char16_t> local_158;
  QLatin1String local_138;
  QLatin1String local_128;
  QArrayDataPointer<char16_t> local_118;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  QArrayDataPointer<char> local_f0;
  QScopedPointer<char,_QScopedPointerPodDeleter> local_d8;
  char *fn;
  BacktraceParams local_c8;
  Data local_a8;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  QArrayDataPointer<char16_t> local_88;
  Data local_68;
  Data *pDStack_60;
  undefined1 *local_58;
  Data DStack_50;
  char16_t *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  this = &QMessagePattern::mutex;
  QBasicMutex::lock(&QMessagePattern::mutex);
  pTVar10 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qMessagePattern>_>::
            operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qMessagePattern>_>
                        *)this);
  if (pTVar10 == (Type *)0x0) {
    QString::append(__return_storage_ptr__,str);
  }
  else {
    bVar19 = type != QtFatalMsg;
    bVar20 = type != QtCriticalMsg;
    bVar21 = type != QtWarningMsg;
    bVar22 = type != QtInfoMsg;
    bVar23 = type != QtDebugMsg;
    __i = 0;
    local_250 = 0;
    iVar25 = 0;
    bVar8 = 0;
    while (ppcVar11 = std::unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>::
                      operator[](&pTVar10->tokens,__i), *ppcVar11 != (char *)0x0) {
      ppcVar11 = std::unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>::operator[]
                           (&pTVar10->tokens,__i);
      pcVar13 = *ppcVar11;
      if (pcVar13 == "%{endif}") goto LAB_002014f4;
      if ((bVar8 & 1) != 0) {
        if (pcVar13 == "%{time") {
          iVar25 = iVar25 + 1;
        }
        else {
          local_250 = local_250 + (uint)(pcVar13 == "%{backtrace");
        }
        bVar8 = 1;
        goto LAB_002014f7;
      }
      if (pcVar13 == "%{message}") {
        QString::append(__return_storage_ptr__,str);
LAB_002014f4:
        bVar8 = 0;
      }
      else {
        if (pcVar13 == "%{category}") {
          pcVar13 = context->category;
          this_01 = &local_1b8;
LAB_00200924:
          QLatin1String::QLatin1String(this_01,pcVar13);
          str_00.m_size = this_01->m_size;
          str_00.m_data = this_01->m_data;
          QString::append(__return_storage_ptr__,str_00);
          goto LAB_002014f4;
        }
        if (pcVar13 == "%{type}") {
          if (type < (QtInfoMsg|QtWarningMsg)) {
            qStackY_270 = *(qsizetype *)(&DAT_00463f90 + (ulong)type * 8);
            pcVar13 = &DAT_00463fb8 + *(int *)(&DAT_00463fb8 + (ulong)type * 4);
            goto LAB_00200992;
          }
          goto LAB_002014f4;
        }
        if (pcVar13 == "%{file}") {
          data = context->file;
          qStackY_270 = 7;
          pcVar13 = "unknown";
          if (data != (char *)0x0) {
            qStackY_270 = QtPrivate::lengthHelperPointer<char>(data);
            pcVar13 = data;
          }
LAB_00200992:
          str_01.m_data = pcVar13;
          str_01.m_size = qStackY_270;
          QString::append(__return_storage_ptr__,str_01);
          goto LAB_002014f4;
        }
        if (pcVar13 == "%{line}") {
          QString::number((QString *)&local_68.data,context->line,10);
          QString::append(__return_storage_ptr__,(QString *)&local_68.data);
          goto LAB_002014ec;
        }
        if (pcVar13 == "%{function}") {
          qStackY_270 = 7;
          pcVar13 = "unknown";
          if (context->function != (char *)0x0) {
            QByteArray::QByteArray((QByteArray *)&local_1d0,context->function,-1);
            info.d.ptr._0_7_ = in_stack_fffffffffffffda0;
            info.d.d = (Data *)__return_storage_ptr__;
            info.d.ptr._7_1_ = bVar19;
            info.d.size._0_1_ = bVar20;
            info.d.size._1_1_ = bVar21;
            info.d.size._2_1_ = bVar22;
            info.d.size._3_1_ = bVar23;
            info.d.size._4_4_ = iVar25;
            qCleanupFuncinfo((QByteArray *)&local_118,info);
            QString::fromLatin1<void>((QString *)&local_68.data,(QByteArray *)&local_118);
            QString::append(__return_storage_ptr__,(QString *)&local_68.data);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_68.data);
            QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_118);
            QArrayDataPointer<char>::~QArrayDataPointer(&local_1d0);
            goto LAB_002014f4;
          }
          goto LAB_00200992;
        }
        if (pcVar13 == "%{pid}") {
          n = QCoreApplication::applicationPid();
          QString::number((QString *)&local_68.data,n,10);
          QString::append(__return_storage_ptr__,(QString *)&local_68.data);
LAB_002014ec:
          pDVar18 = &local_68;
LAB_002014ef:
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)&pDVar18->data);
          goto LAB_002014f4;
        }
        if (pcVar13 == "%{appname}") {
          QCoreApplication::applicationName();
          QString::append(__return_storage_ptr__,(QString *)&local_68.data);
          goto LAB_002014ec;
        }
        if (pcVar13 == "%{threadid}") {
          lVar17 = qt_gettid();
          QString::number((QString *)&local_68.data,lVar17,10);
          QString::append(__return_storage_ptr__,(QString *)&local_68.data);
          goto LAB_002014ec;
        }
        if (pcVar13 == "%{threadname}") {
          local_68.d = (QDateTimePrivate *)0x0;
          pDStack_60 = (Data *)0x0;
          __target_thread = pthread_self();
          iVar9 = pthread_getname_np(__target_thread,(char *)&local_68,0x10);
          if ((iVar9 == 0) &&
             (qVar14 = QtPrivate::lengthHelperPointer<char>((char *)&local_68), qVar14 != 0)) {
            str_03.m_size = qVar14;
            str_03.m_data = (storage_type *)&local_68;
            QString::append(__return_storage_ptr__,str_03);
            goto LAB_002014f4;
          }
          lVar17 = qt_gettid();
          QString::number((QString *)&local_68.data,lVar17,10);
          QString::append(__return_storage_ptr__,(QString *)&local_68.data);
          goto LAB_002014ec;
        }
        if (pcVar13 == "%{qthreadptr}") {
          str_02.m_data = "0x";
          str_02.m_size = 2;
          QString::append(__return_storage_ptr__,str_02);
          QThread::currentThread();
          n_00 = QThread::currentThread();
          QString::number((QString *)&local_68.data,(qlonglong)n_00,0x10);
          QString::append(__return_storage_ptr__,(QString *)&local_68.data);
          goto LAB_002014ec;
        }
        if (pcVar13 == "%{backtrace") {
          local_98 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
          local_a8.d = (QDateTimePrivate *)&DAT_aaaaaaaaaaaaaaaa;
          puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
          QMessagePattern::BacktraceParams::BacktraceParams
                    ((BacktraceParams *)&local_a8.data,(pTVar10->backtraceArgs).d.ptr + local_250);
          QMessagePattern::BacktraceParams::BacktraceParams
                    (&local_c8,(BacktraceParams *)&local_a8.data);
          if ((context->version < 3) || (*(char *)&context[9].category == '\0')) {
            local_1e8.d = (Data *)0x0;
            local_1e8.ptr = (char16_t *)0x0;
            local_1e8.size = 0;
          }
          else {
            local_190.d = local_c8.backtraceSeparator.d.d;
            local_190.ptr = local_c8.backtraceSeparator.d.ptr;
            local_190.size = local_c8.backtraceSeparator.d.size;
            if (local_c8.backtraceSeparator.d.d != (Data *)0x0) {
              LOCK();
              ((local_c8.backtraceSeparator.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i =
                   ((local_c8.backtraceSeparator.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            lVar17 = (long)local_c8.backtraceDepth;
            pQVar12 = std::
                      _Optional_base_impl<QVarLengthArray<void_*,_32LL>,_std::_Optional_base<QVarLengthArray<void_*,_32LL>,_false,_false>_>
                      ::_M_get((_Optional_base_impl<QVarLengthArray<void_*,_32LL>,_std::_Optional_base<QVarLengthArray<void_*,_32LL>,_false,_false>_>
                                *)(context + 1));
            local_1a8.size = 0;
            local_1a8.d = (Data *)0x0;
            local_1a8.ptr = (QString *)0x0;
            if (lVar17 == 0) {
LAB_00201430:
              local_1e8.d = (Data *)0x0;
              local_1e8.ptr = (char16_t *)0x0;
              local_1e8.size = 0;
            }
            else {
              local_178.d = (Data *)0x0;
              local_178.ptr = (char16_t *)0x0;
              local_178.size = 0;
              lVar1 = (pQVar12->super_QVLABase<void_*>).super_QVLABaseBase.s;
              pvVar2 = (pQVar12->super_QVLABase<void_*>).super_QVLABaseBase.ptr;
              lVar16 = 0;
              local_238 = (Data *)0x0;
              do {
                if (lVar1 << 3 == lVar16) break;
                local_48 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
                local_58 = &DAT_aaaaaaaaaaaaaaaa;
                DStack_50.d = (QDateTimePrivate *)&DAT_aaaaaaaaaaaaaaaa;
                local_68.d = (QDateTimePrivate *)&DAT_aaaaaaaaaaaaaaaa;
                pDStack_60 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                local_118.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                uStack_100 = 0xaaaaaaaa;
                uStack_fc = 0xaaaaaaaa;
                local_118.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                local_118.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                iVar9 = dladdr(*(undefined8 *)((long)pvVar2 + lVar16),&local_118);
                if (iVar9 == 0) {
                  local_48 = (char16_t *)0x0;
                  puStack_40 = (undefined1 *)0x0;
                  local_58 = (undefined1 *)0x0;
                  DStack_50.d = (QDateTimePrivate *)0x0;
                  local_68.d = (QDateTimePrivate *)0x0;
                  pDStack_60 = (Data *)0x0;
LAB_00201088:
                  this_00 = &local_88;
                  if (local_1a8.size != 0) {
                    local_88.d = (Data *)0x0;
                    local_88.ptr = (char16_t *)0x0;
                    local_118.d = (Data *)0x0;
                    local_118.ptr = L"???";
                    local_88.size = 0;
                    local_118.size = (qsizetype)&DAT_00000003;
                    QList<QString>::emplaceBack<QString>
                              ((QList<QString> *)&local_1a8,(QString *)&local_118);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
LAB_00201133:
                    QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
                  }
                }
                else {
                  local_128.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                  local_128.m_data = &DAT_aaaaaaaaaaaaaaaa;
                  QLatin1String::QLatin1String(&local_128,(char *)local_118.size);
                  pDVar5 = local_118.d;
                  local_138.m_size = 0;
                  local_138.m_data = (char *)0x0;
                  pcVar13 = strrchr((char *)local_118.d,0x2f);
                  if (pcVar13 == (char *)0x0) {
                    QLatin1String::QLatin1String((QLatin1String *)&local_88,(char *)pDVar5);
                    local_138.m_size = (qsizetype)local_88.d;
                    local_138.m_data = (char *)local_88.ptr;
                  }
                  else {
                    local_138.m_size = QtPrivate::lengthHelperPointer<char>(pcVar13 + 1);
                    local_138.m_data = (char *)(pcVar13 + 1);
                  }
                  if (local_1a8.size == 0) {
                    qVar14 = QtPrivate::lengthHelperPointer<char>("Qt6Core");
                    s.m_data = "Qt6Core";
                    s.m_size = qVar14;
                    bVar7 = QLatin1String::contains(&local_138,s,CaseSensitive);
                    if ((bVar7) &&
                       (((((undefined1 *)local_128.m_size == (undefined1 *)0x0 ||
                          (s_00.m_data = "6QDebug", s_00.m_size = 7,
                          bVar7 = QLatin1String::contains(&local_128,s_00,CaseSensitive), bVar7)) ||
                         (s_01.m_data = "14QMessageLogger", s_01.m_size = 0x10,
                         bVar7 = QLatin1String::contains(&local_128,s_01,CaseSensitive), bVar7)) ||
                        ((s_02.m_data = "17qt_message_output", s_02.m_size = 0x13,
                         bVar7 = QLatin1String::contains(&local_128,s_02,CaseSensitive), bVar7 ||
                         (s_03.m_data = "26QInternalMessageLogContext", s_03.m_size = 0x1c,
                         bVar7 = QLatin1String::contains(&local_128,s_03,CaseSensitive), bVar7))))))
                    {
                      local_48 = (char16_t *)0x0;
                      puStack_40 = (undefined1 *)0x0;
                      local_58 = (undefined1 *)0x0;
                      DStack_50.d = (QDateTimePrivate *)0x0;
                      local_68.d = (QDateTimePrivate *)0x0;
                      pDStack_60 = (Data *)0x0;
                      goto LAB_00201088;
                    }
                  }
                  local_158.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                  local_158.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                  local_158.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                  size = (storage_type *)0x1;
                  s_04.m_data = "_Z";
                  s_04.m_size = 2;
                  bVar7 = QLatin1String::startsWith(&local_128,s_04,CaseSensitive);
                  if (bVar7) {
                    fn = local_128.m_data;
                    local_d8.d = (char *)0x0;
                    size = (storage_type *)0x0;
                    pcVar13 = (char *)__cxa_demangle(local_128.m_data,0,0);
                    QScopedPointer<char,_QScopedPointerPodDeleter>::reset(&local_d8,pcVar13);
                    if (local_d8.d == (char *)0x0) {
                      QByteArrayView::QByteArrayView<const_char_*,_true>
                                ((QByteArrayView *)&local_88,&fn);
                      ba.m_data = size;
                      ba.m_size = (qsizetype)local_88.ptr;
                      QString::fromUtf8((QString *)&local_158,(QString *)local_88.d,ba);
                    }
                    else {
                      QByteArray::QByteArray((QByteArray *)&local_f0,local_d8.d,-1);
                      info_00.d.ptr._0_7_ = in_stack_fffffffffffffda0;
                      info_00.d.d = (Data *)__return_storage_ptr__;
                      info_00.d.ptr._7_1_ = bVar19;
                      info_00.d.size._0_1_ = bVar20;
                      info_00.d.size._1_1_ = bVar21;
                      info_00.d.size._2_1_ = bVar22;
                      info_00.d.size._3_1_ = bVar23;
                      info_00.d.size._4_4_ = iVar25;
                      qCleanupFuncinfo((QByteArray *)&local_88,info_00);
                      QString::fromUtf8<void>((QString *)&local_158,(QByteArray *)&local_88);
                      QArrayDataPointer<char>::~QArrayDataPointer
                                ((QArrayDataPointer<char> *)&local_88);
                      QArrayDataPointer<char>::~QArrayDataPointer(&local_f0);
                    }
                    free(local_d8.d);
                  }
                  else {
                    latin1.m_data = local_128.m_data;
                    latin1.m_size = local_128.m_size;
                    QString::QString((QString *)&local_158,latin1);
                  }
                  pcVar13 = local_138.m_data;
                  if ((Data *)local_138.m_data != local_238) {
                    QString::fromUtf8((QString *)&local_88,(QString *)local_138.m_data,
                                      (char *)local_138.m_size,(qsizetype)size);
                    qVar14 = local_178.size;
                    pcVar6 = local_178.ptr;
                    pDVar5 = local_178.d;
                    local_178.d = local_88.d;
                    local_178.ptr = local_88.ptr;
                    local_88.d = pDVar5;
                    local_88.ptr = pcVar6;
                    local_178.size = local_88.size;
                    local_88.size = qVar14;
                    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
                    local_238 = (Data *)pcVar13;
                  }
                  local_68.d = (QDateTimePrivate *)local_178.d;
                  pDStack_60 = (Data *)local_178.ptr;
                  local_58 = (undefined1 *)local_178.size;
                  if ((QDateTimePrivate *)local_178.d != (QDateTimePrivate *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)&((DataPointer *)&(local_178.d)->super_QArrayData)->d)->
                    _q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)&((DataPointer *)&(local_178.d)->super_QArrayData)->d)
                         ->_q_value).super___atomic_base<int>._M_i + 1;
                    UNLOCK();
                  }
                  DStack_50.d = (QDateTimePrivate *)local_158.d;
                  local_48 = local_158.ptr;
                  puStack_40 = (undefined1 *)local_158.size;
                  if ((QDateTimePrivate *)local_158.d != (QDateTimePrivate *)0x0) {
                    LOCK();
                    ((local_158.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                         ((local_158.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                         _M_i + 1;
                    UNLOCK();
                  }
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_158);
                  if (local_58 == (undefined1 *)0x0) goto LAB_00201088;
                  if (puStack_40 == (undefined1 *)0x0) {
                    local_88.d = (Data *)CONCAT62(local_88.d._2_6_,0x3f);
                    local_88.size = CONCAT62(local_88.size._2_6_,0x3f);
                    this_00 = &local_118;
                    local_88.ptr = (char16_t *)&local_68;
                    QStringBuilder<QStringBuilder<char16_t,_QString_&>,_char16_t>::
                    convertTo<QString>((QString *)this_00,
                                       (QStringBuilder<QStringBuilder<char16_t,_QString_&>,_char16_t>
                                        *)&local_88);
                    QList<QString>::emplaceBack<QString>
                              ((QList<QString> *)&local_1a8,(QString *)this_00);
                    goto LAB_00201133;
                  }
                  QList<QString>::emplaceBack<QString_const&>
                            ((QList<QString> *)&local_1a8,(QString *)&DStack_50.data);
                }
                qVar14 = local_1a8.size;
                backtraceFramesForLogMessage::DecodedFrame::~DecodedFrame
                          ((DecodedFrame *)&local_68.data);
                lVar16 = lVar16 + 8;
              } while (qVar14 != lVar17);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_178);
              if (local_1a8.size == 0) goto LAB_00201430;
              if ((context->function != (char *)0x0) &&
                 (bVar7 = QString::startsWith(local_1a8.ptr,(QChar)0x3f,CaseSensitive), bVar7)) {
                QByteArray::QByteArray((QByteArray *)&local_88,context->function,-1);
                info_01.d.ptr._0_7_ = in_stack_fffffffffffffda0;
                info_01.d.d = (Data *)__return_storage_ptr__;
                info_01.d.ptr._7_1_ = bVar19;
                info_01.d.size._0_1_ = bVar20;
                info_01.d.size._1_1_ = bVar21;
                info_01.d.size._2_1_ = bVar22;
                info_01.d.size._3_1_ = bVar23;
                info_01.d.size._4_4_ = iVar25;
                qCleanupFuncinfo((QByteArray *)&local_118,info_01);
                QString::fromUtf8<void>((QString *)&local_68.data,(QByteArray *)&local_118);
                pQVar15 = QList<QString>::data((QList<QString> *)&local_1a8);
                DVar4 = (Data)(pQVar15->d).d;
                pDVar18 = (Data *)(pQVar15->d).ptr;
                (pQVar15->d).d = (Data *)local_68;
                (pQVar15->d).ptr = (char16_t *)pDStack_60;
                qVar14 = (pQVar15->d).size;
                (pQVar15->d).size = (qsizetype)local_58;
                local_68 = DVar4;
                pDStack_60 = pDVar18;
                local_58 = (undefined1 *)qVar14;
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_68.data);
                QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_118);
                QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_88);
              }
              QListSpecialMethods<QString>::join
                        ((QString *)&local_1e8,(QListSpecialMethods<QString> *)&local_1a8,
                         (QString *)&local_190);
            }
            QArrayDataPointer<QString>::~QArrayDataPointer(&local_1a8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_190);
          }
          QString::append(__return_storage_ptr__,(QString *)&local_1e8);
          pDVar18 = &local_a8;
          local_250 = local_250 + 1;
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c8);
          goto LAB_002014ef;
        }
        if (pcVar13 == "%{time") {
          pQVar3 = (pTVar10->timeArgs).d.ptr;
          local_68 = (Data)pQVar3[iVar25].d.d;
          pDStack_60 = (Data *)pQVar3[iVar25].d.ptr;
          local_58 = (undefined1 *)pQVar3[iVar25].d.size;
          if (local_68.d != (QDateTimePrivate *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)&((DataPointer *)&(local_68.d)->super_QSharedData)->d)->_q_value).
            super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)&((DataPointer *)&(local_68.d)->super_QSharedData)->d)->
                 _q_value).super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_118.d = (Data *)0x7;
          local_118.ptr = L"process";
          bVar7 = operator==((QString *)&local_68.data,(QLatin1StringView *)&local_118);
          if (bVar7) {
            auVar24 = std::chrono::_V2::steady_clock::now();
            formatLogMessage::anon_class_1_0_00000001::operator()
                      ((QString *)&local_118,
                       (anon_class_1_0_00000001 *)(auVar24._0_8_ - (pTVar10->appStartTime).__d.__r),
                       (duration)auVar24._8_8_);
            QString::append(__return_storage_ptr__,(QString *)&local_118);
LAB_002013cb:
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
          }
          else {
            local_118.d = (Data *)0x4;
            local_118.ptr = L"boot";
            bVar7 = operator==((QString *)&local_68.data,(QLatin1StringView *)&local_118);
            if (bVar7) {
              auVar24 = std::chrono::_V2::steady_clock::now();
              formatLogMessage::anon_class_1_0_00000001::operator()
                        ((QString *)&local_118,auVar24._0_8_,(duration)auVar24._8_8_);
              QString::append(__return_storage_ptr__,(QString *)&local_118);
              goto LAB_002013cb;
            }
            if (local_58 == (undefined1 *)0x0) {
              QDateTime::currentDateTime();
              QDateTime::toString((QString *)&local_118,(QDateTime *)&local_a8.data,ISODate);
              QString::append(__return_storage_ptr__,(QString *)&local_118);
            }
            else {
              QDateTime::currentDateTime();
              QDateTime::toString((QString *)&local_118,(QDateTime *)&local_a8.data,
                                  (QString *)&local_68.data);
              QString::append(__return_storage_ptr__,(QString *)&local_118);
            }
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
            QDateTime::~QDateTime((QDateTime *)&local_a8.data);
          }
          iVar25 = iVar25 + 1;
          goto LAB_002014ec;
        }
        if (pcVar13 == "%{if-category}") {
          bVar8 = isDefaultCategory(context->category);
        }
        else {
          bVar8 = bVar23;
          if ((((pcVar13 != "%{if-debug}") && (bVar8 = bVar22, pcVar13 != "%{if-info}")) &&
              (bVar8 = bVar21, pcVar13 != "%{if-warning}")) &&
             ((bVar8 = bVar20, pcVar13 != "%{if-critical}" &&
              (bVar8 = bVar19, pcVar13 != "%{if-fatal}")))) {
            this_01 = &local_1f8;
            goto LAB_00200924;
          }
        }
      }
LAB_002014f7:
      __i = __i + 1;
    }
  }
  QBasicMutex::unlock(&QMessagePattern::mutex);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

static QString formatLogMessage(QtMsgType type, const QMessageLogContext &context, const QString &str)
{
    QString message;

    const auto locker = qt_scoped_lock(QMessagePattern::mutex);

    QMessagePattern *pattern = qMessagePattern();
    if (!pattern) {
        // after destruction of static QMessagePattern instance
        message.append(str);
        return message;
    }

    bool skip = false;

    int timeArgsIdx = 0;
#ifdef QLOGGING_HAVE_BACKTRACE
    int backtraceArgsIdx = 0;
#endif

    // we do not convert file, function, line literals to local encoding due to overhead
    for (int i = 0; pattern->tokens[i]; ++i) {
        const char *token = pattern->tokens[i];
        if (token == endifTokenC) {
            skip = false;
        } else if (skip) {
            // we skip adding messages, but we have to iterate over
            // timeArgsIdx and backtraceArgsIdx anyway
            if (token == timeTokenC)
                timeArgsIdx++;
#ifdef QLOGGING_HAVE_BACKTRACE
            else if (token == backtraceTokenC)
                backtraceArgsIdx++;
#endif
        } else if (token == messageTokenC) {
            message.append(str);
        } else if (token == categoryTokenC) {
            message.append(QLatin1StringView(context.category));
        } else if (token == typeTokenC) {
            switch (type) {
            case QtDebugMsg:   message.append("debug"_L1); break;
            case QtInfoMsg:    message.append("info"_L1); break;
            case QtWarningMsg: message.append("warning"_L1); break;
            case QtCriticalMsg:message.append("critical"_L1); break;
            case QtFatalMsg:   message.append("fatal"_L1); break;
            }
        } else if (token == fileTokenC) {
            if (context.file)
                message.append(QLatin1StringView(context.file));
            else
                message.append("unknown"_L1);
        } else if (token == lineTokenC) {
            message.append(QString::number(context.line));
        } else if (token == functionTokenC) {
            if (context.function)
                message.append(QString::fromLatin1(qCleanupFuncinfo(context.function)));
            else
                message.append("unknown"_L1);
        } else if (token == pidTokenC) {
            message.append(QString::number(QCoreApplication::applicationPid()));
        } else if (token == appnameTokenC) {
            message.append(QCoreApplication::applicationName());
        } else if (token == threadidTokenC) {
            // print the TID as decimal
            message.append(QString::number(qt_gettid()));
        } else if (token == threadnameTokenC) {
            if (!qt_append_thread_name_to(message))
                message.append(QString::number(qt_gettid())); // fallback to the TID
        } else if (token == qthreadptrTokenC) {
            message.append("0x"_L1);
            message.append(QString::number(qlonglong(QThread::currentThread()->currentThread()), 16));
#ifdef QLOGGING_HAVE_BACKTRACE
        } else if (token == backtraceTokenC) {
            QMessagePattern::BacktraceParams backtraceParams = pattern->backtraceArgs.at(backtraceArgsIdx);
            backtraceArgsIdx++;
            message.append(formatBacktraceForLogMessage(backtraceParams, context));
#endif
        } else if (token == timeTokenC) {
            using namespace std::chrono;
            auto formatElapsedTime = [](steady_clock::duration time) {
                // we assume time > 0
                auto ms = duration_cast<milliseconds>(time);
                auto sec = duration_cast<seconds>(ms);
                ms -= sec;
                return QString::asprintf("%6lld.%03u", qint64(sec.count()), uint(ms.count()));
            };
            QString timeFormat = pattern->timeArgs.at(timeArgsIdx);
            timeArgsIdx++;
            if (timeFormat == "process"_L1) {
                message += formatElapsedTime(steady_clock::now() - pattern->appStartTime);
            } else if (timeFormat == "boot"_L1) {
                // just print the milliseconds since the elapsed timer reference
                // like the Linux kernel does
                message += formatElapsedTime(steady_clock::now().time_since_epoch());
#if QT_CONFIG(datestring)
            } else if (timeFormat.isEmpty()) {
                message.append(QDateTime::currentDateTime().toString(Qt::ISODate));
            } else {
                message.append(QDateTime::currentDateTime().toString(timeFormat));
#endif // QT_CONFIG(datestring)
            }
        } else if (token == ifCategoryTokenC) {
            if (isDefaultCategory(context.category))
                skip = true;
#define HANDLE_IF_TOKEN(LEVEL)  \
        } else if (token == if##LEVEL##TokenC) { \
            skip = type != Qt##LEVEL##Msg;
        HANDLE_IF_TOKEN(Debug)
        HANDLE_IF_TOKEN(Info)
        HANDLE_IF_TOKEN(Warning)
        HANDLE_IF_TOKEN(Critical)
        HANDLE_IF_TOKEN(Fatal)
#undef HANDLE_IF_TOKEN
        } else {
            message.append(QLatin1StringView(token));
        }
    }
    return message;
}